

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O3

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound,long volume)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  float fVar4;
  double dVar5;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x12a818);
    }
    lVar3 = -10000;
    if (-10000 < volume) {
      lVar3 = volume;
    }
    dVar5 = pow(10.0,(double)(int)((uint)(lVar3 >> 0x3f) & (uint)lVar3) / 2000.0);
    fVar4 = (float)dVar5;
    sound->volume = fVar4;
    uVar1 = sound->pan_l;
    uVar2 = sound->pan_r;
    sound->volume_l = fVar4 * (float)uVar1;
    sound->volume_r = fVar4 * (float)uVar2;
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_unlock)(0x12a818);
      return;
    }
  }
  return;
}

Assistant:

void AudioBackend_SetSoundVolume(AudioBackend_Sound *sound, long volume)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	SetSoundVolume(sound, volume);

	ma_mutex_unlock(&mutex);
}